

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddRawTransaction
          (ElementsTransactionApi *this,string *tx_hex,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *in_RCX;
  ConfidentialTransactionController *in_RDI;
  undefined8 in_R8;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar4;
  Amount AVar5;
  ConfidentialTxOut *in_stack_00000010;
  long in_stack_00000018;
  Address dummy_addr;
  Address pegout_address;
  TxOutPegoutParameters *pegout_data;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
  *__range2_3;
  ConfidentialTxOut *txout;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *__range2_2;
  TxInPeginParameters *pegin_data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_> *__range2_1;
  ConfidentialTxIn *txin;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range2;
  uint32_t kLockTimeDisabledSequence;
  ConfidentialTransactionController *ctxc;
  AbstractTransactionController *in_stack_fffffffffffff218;
  undefined4 uVar6;
  Address *in_stack_fffffffffffff220;
  string *in_stack_fffffffffffff228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  ConfidentialTransactionController *in_stack_fffffffffffff230;
  string *this_00;
  uint32_t in_stack_fffffffffffff238;
  uint32_t in_stack_fffffffffffff23c;
  ConfidentialAssetId *in_stack_fffffffffffff240;
  NetType_conflict in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff24c;
  Script *in_stack_fffffffffffff250;
  undefined7 in_stack_fffffffffffff258;
  undefined1 in_stack_fffffffffffff25f;
  BlockHash *in_stack_fffffffffffff2a8;
  ConfidentialAssetId *in_stack_fffffffffffff2b0;
  Amount *in_stack_fffffffffffff2b8;
  undefined8 in_stack_fffffffffffff2c0;
  Txid *in_stack_fffffffffffff2c8;
  undefined5 in_stack_fffffffffffff2d0;
  undefined1 in_stack_fffffffffffff2d5;
  undefined1 in_stack_fffffffffffff2d6;
  undefined1 in_stack_fffffffffffff2d7;
  uint32_t in_stack_fffffffffffff2e8;
  uint32_t in_stack_fffffffffffff2ec;
  uint32_t in_stack_fffffffffffff2f0;
  uint32_t in_stack_fffffffffffff2f4;
  ConfidentialAssetId local_ce8;
  int64_t local_cc0;
  undefined1 local_cb8;
  ConfidentialValue local_cb0;
  int64_t local_c88;
  undefined1 local_c80;
  int64_t local_b80;
  undefined1 local_b78;
  ConfidentialValue local_b70;
  Amount local_b48;
  _Base_ptr local_b38;
  undefined1 local_b30;
  string local_b28;
  undefined1 local_b08 [32];
  string local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  Pubkey local_aa8 [2];
  Address *in_stack_fffffffffffff588;
  BlockHash *in_stack_fffffffffffff590;
  ConfidentialAssetId *in_stack_fffffffffffff598;
  Amount *in_stack_fffffffffffff5a0;
  ConfidentialTransactionController *in_stack_fffffffffffff5a8;
  NetType in_stack_fffffffffffff5c0;
  Pubkey *in_stack_fffffffffffff5c8;
  Privkey *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff5d8;
  uint32_t in_stack_fffffffffffff5e0;
  ByteData *in_stack_fffffffffffff5e8;
  NetType in_stack_fffffffffffff5f0;
  Address *in_stack_fffffffffffff5f8;
  Address local_8a0;
  Address local_728;
  reference local_5b0;
  TxOutPegoutParameters *local_5a8;
  __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
  local_5a0 [2];
  ConfidentialNonce local_590;
  ConfidentialAssetId local_568;
  int64_t local_540;
  undefined1 local_538;
  ConfidentialValue local_530;
  int64_t local_508;
  undefined1 local_500;
  Script local_4f8 [5];
  ConfidentialTxOut *local_3c8;
  __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
  local_3c0;
  __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
  local_3b8;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_3b0;
  reference local_3a8;
  TxInPeginParameters *local_3a0;
  __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
  local_398;
  undefined8 local_390;
  Txid local_388 [12];
  Txid local_208 [12];
  reference local_88;
  __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_80;
  __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_78;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_70;
  uint32_t local_58;
  undefined1 local_51;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_50;
  undefined8 local_48;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_40;
  
  local_51 = 0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  local_58 = AbstractTransactionController::GetLockTimeDisabledSequence();
  local_70 = local_40;
  local_78._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::begin
                 (local_40);
  local_80._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::end
                 (local_70);
  while (bVar2 = __gnu_cxx::operator!=(&local_78,&local_80), bVar2) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
               ::operator*(&local_78);
    uVar1 = local_58;
    uVar3 = core::AbstractTxIn::GetSequence(&local_88->super_AbstractTxIn);
    if (uVar1 == uVar3) {
      core::AbstractTxIn::GetTxid(local_208,&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2f4 = core::AbstractTxIn::GetVout(&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2f0 =
           AbstractTransactionController::GetDefaultSequence(in_stack_fffffffffffff218);
      ConfidentialTransactionController::AddTxIn
                ((ConfidentialTransactionController *)
                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                 (Txid *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
                 in_stack_fffffffffffff238);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)in_stack_fffffffffffff220);
      core::Txid::~Txid((Txid *)0x55fa2b);
    }
    else {
      core::AbstractTxIn::GetTxid(local_388,&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2ec = core::AbstractTxIn::GetVout(&local_88->super_AbstractTxIn);
      in_stack_fffffffffffff2e8 = core::AbstractTxIn::GetSequence(&local_88->super_AbstractTxIn);
      ConfidentialTransactionController::AddTxIn
                ((ConfidentialTransactionController *)
                 CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                 (Txid *)in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
                 in_stack_fffffffffffff238);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)in_stack_fffffffffffff220);
      core::Txid::~Txid((Txid *)0x55fafa);
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&local_78);
  }
  local_390 = local_48;
  local_398._M_current =
       (TxInPeginParameters *)
       std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>::
       begin((vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              *)in_stack_fffffffffffff218);
  local_3a0 = (TxInPeginParameters *)
              std::
              vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              ::end((vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
                     *)in_stack_fffffffffffff218);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                             *)in_stack_fffffffffffff220,
                            (__normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                             *)in_stack_fffffffffffff218), bVar2) {
    local_3a8 = __gnu_cxx::
                __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
                ::operator*(&local_398);
    in_stack_fffffffffffff218 = (AbstractTransactionController *)&local_3a8->claim_script;
    in_stack_fffffffffffff220 = (Address *)&local_3a8->mainchain_raw_tx;
    ConfidentialTransactionController::AddPeginWitness
              ((ConfidentialTransactionController *)
               CONCAT17(in_stack_fffffffffffff2d7,
                        CONCAT16(in_stack_fffffffffffff2d6,
                                 CONCAT15(in_stack_fffffffffffff2d5,in_stack_fffffffffffff2d0))),
               in_stack_fffffffffffff2c8,(uint32_t)((ulong)in_stack_fffffffffffff2c0 >> 0x20),
               in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,
               (Script *)local_3a8,
               (ByteData *)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
               (ByteData *)CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0));
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxInPeginParameters_*,_std::vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>_>
    ::operator++(&local_398);
  }
  local_3b0 = local_50;
  local_3b8._M_current =
       (ConfidentialTxOut *)
       std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
       begin(local_50);
  local_3c0._M_current =
       (ConfidentialTxOut *)
       std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::end
                 (local_3b0);
  while (bVar2 = __gnu_cxx::operator!=(&local_3b8,&local_3c0), bVar2) {
    local_3c8 = __gnu_cxx::
                __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
                ::operator*(&local_3b8);
    core::AbstractTxOut::GetLockingScript(local_4f8,&local_3c8->super_AbstractTxOut);
    core::ConfidentialTxOut::GetConfidentialValue(&local_530,local_3c8);
    AVar5 = core::ConfidentialValue::GetAmount(&local_530);
    local_540 = AVar5.amount_;
    local_538 = AVar5.ignore_check_;
    local_508 = local_540;
    local_500 = local_538;
    core::ConfidentialTxOut::GetAsset(&local_568,local_3c8);
    core::ConfidentialTxOut::GetNonce(&local_590,local_3c8);
    ConfidentialTransactionController::AddTxOut
              ((ConfidentialTransactionController *)
               CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
               in_stack_fffffffffffff250,
               (Amount *)CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240,
               (ConfidentialNonce *)CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)in_stack_fffffffffffff220);
    core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)0x55fd8b);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x55fd98);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x55fda5);
    core::Script::~Script((Script *)in_stack_fffffffffffff220);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
    ::operator++(&local_3b8);
  }
  local_5a0[0]._M_current =
       (TxOutPegoutParameters *)
       std::
       vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>::
       begin((vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              *)in_stack_fffffffffffff218);
  local_5a8 = (TxOutPegoutParameters *)
              std::
              vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              ::end((vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
                     *)in_stack_fffffffffffff218);
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                        *)in_stack_fffffffffffff220,
                       (__normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                        *)in_stack_fffffffffffff218);
    if (!bVar2) {
      core::ConfidentialTxOut::GetConfidentialValue(&local_b70,in_stack_00000010);
      AVar5 = core::ConfidentialValue::GetAmount(&local_b70);
      local_b80 = AVar5.amount_;
      local_b78 = AVar5.ignore_check_;
      local_b48.amount_ = local_b80;
      local_b48.ignore_check_ = (bool)local_b78;
      bVar2 = core::Amount::operator!=(&local_b48,0);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5603ad);
      if (bVar2) {
        core::ConfidentialTxOut::GetConfidentialValue(&local_cb0,in_stack_00000010);
        AVar5 = core::ConfidentialValue::GetAmount(&local_cb0);
        local_cc0 = AVar5.amount_;
        local_cb8 = AVar5.ignore_check_;
        local_c88 = local_cc0;
        local_c80 = local_cb8;
        core::ConfidentialTxOut::GetAsset(&local_ce8,in_stack_00000010);
        ConfidentialTransactionController::AddTxOutFee
                  ((ConfidentialTransactionController *)
                   CONCAT44(in_stack_fffffffffffff24c,in_stack_fffffffffffff248),
                   (Amount *)in_stack_fffffffffffff240,
                   (ConfidentialAssetId *)
                   CONCAT44(in_stack_fffffffffffff23c,in_stack_fffffffffffff238));
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                  ((ConfidentialTxOutReference *)in_stack_fffffffffffff220);
        core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x560477);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x560484);
      }
      return in_RDI;
    }
    local_5b0 = __gnu_cxx::
                __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
                ::operator*(local_5a0);
    core::Address::Address(&local_728);
    bVar2 = core::Pubkey::IsValid(&local_5b0->online_pubkey);
    if (bVar2) {
      bVar2 = core::Privkey::IsInvalid((Privkey *)&local_5b0->master_online_key);
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffff218 >> 0x20);
      if (bVar2) goto LAB_0056003d;
      core::Address::Address(&local_8a0);
      in_stack_fffffffffffff220 = (Address *)&local_5b0->online_pubkey;
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_5b0->master_online_key;
      this_00 = &local_5b0->bitcoin_descriptor;
      in_stack_fffffffffffff238 = local_5b0->bip32_counter;
      in_stack_fffffffffffff240 = (ConfidentialAssetId *)&local_5b0->whitelist;
      in_stack_fffffffffffff248 = local_5b0->elements_net_type;
      in_stack_fffffffffffff218 =
           (AbstractTransactionController *)CONCAT44(uVar6,local_5b0->net_type);
      ConfidentialTransactionController::AddPegoutTxOut
                (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                 in_stack_fffffffffffff590,in_stack_fffffffffffff588,in_stack_fffffffffffff5c0,
                 in_stack_fffffffffffff5c8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5d8,
                 in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                 in_stack_fffffffffffff5f8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff220);
      core::Address::~Address(in_stack_fffffffffffff220);
    }
    else {
LAB_0056003d:
      core::Pubkey::Pubkey(local_aa8);
      core::Privkey::Privkey((Privkey *)&local_ac8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ae8,"",(allocator *)(local_b08 + 0x1f));
      core::ByteData::ByteData((ByteData *)local_b08);
      in_stack_fffffffffffff240 = (ConfidentialAssetId *)local_b08;
      this_00 = &local_ae8;
      __args = &local_ac8;
      in_stack_fffffffffffff220 = (Address *)local_aa8;
      in_stack_fffffffffffff248 = kCfdOutOfRangeError;
      in_stack_fffffffffffff238 = 0;
      in_stack_fffffffffffff218 =
           (AbstractTransactionController *)((ulong)in_stack_fffffffffffff218 & 0xffffffff00000000);
      ConfidentialTransactionController::AddPegoutTxOut
                (in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,
                 in_stack_fffffffffffff590,in_stack_fffffffffffff588,in_stack_fffffffffffff5c0,
                 in_stack_fffffffffffff5c8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5d8,
                 in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                 in_stack_fffffffffffff5f8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)in_stack_fffffffffffff220);
      core::ByteData::~ByteData((ByteData *)0x56017c);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::allocator<char>::~allocator((allocator<char> *)(local_b08 + 0x1f));
      core::Privkey::~Privkey((Privkey *)0x5601a3);
      core::Pubkey::~Pubkey((Pubkey *)0x5601b0);
    }
    if (in_stack_00000018 != 0) {
      core::Address::GetAddress_abi_cxx11_(&local_b28,&local_728);
      pVar4 = std::
              map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              ::emplace<std::__cxx11::string,cfd::core::Amount_const&>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                          *)this_00,__args,(Amount *)in_stack_fffffffffffff220);
      local_b38 = (_Base_ptr)pVar4.first._M_node;
      local_b30 = pVar4.second;
      std::__cxx11::string::~string((string *)&local_b28);
    }
    core::Address::~Address(in_stack_fffffffffffff220);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::TxOutPegoutParameters_*,_std::vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>_>
    ::operator++(local_5a0);
  } while( true );
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddRawTransaction(
    const std::string& tx_hex, const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(tx_hex);

  // TxInの追加
  const uint32_t kLockTimeDisabledSequence =
      ctxc.GetLockTimeDisabledSequence();
  for (const auto& txin : txins) {
    // TxInのunlocking_scriptは空で作成
    if (kLockTimeDisabledSequence == txin.GetSequence()) {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), ctxc.GetDefaultSequence());
    } else {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
    }
  }

  for (const auto& pegin_data : pegins) {
    ctxc.AddPeginWitness(
        pegin_data.txid, pegin_data.vout, pegin_data.amount, pegin_data.asset,
        pegin_data.mainchain_blockhash, pegin_data.claim_script,
        pegin_data.mainchain_raw_tx, pegin_data.mainchain_txoutproof);
  }

  // TxOutの追加
  for (const auto& txout : txouts) {
    ctxc.AddTxOut(
        txout.GetLockingScript(), txout.GetConfidentialValue().GetAmount(),
        txout.GetAsset(), txout.GetNonce());
  }

  for (const auto& pegout_data : pegouts) {
    Address pegout_address;
    if (pegout_data.online_pubkey.IsValid() &&
        !pegout_data.master_online_key.IsInvalid()) {
      Address dummy_addr;
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
          pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
          pegout_data.bip32_counter, pegout_data.whitelist,
          pegout_data.elements_net_type, &pegout_address);
    } else {
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          pegout_data.btc_address);
    }
    if (pegout_addresses != nullptr) {
      pegout_addresses->emplace(
          pegout_address.GetAddress(), pegout_data.amount);
    }
  }

  // amountが0のfeeは無効と判定
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}